

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall embree::BVHN<4>::clear(BVHN<4> *this)

{
  pointer ppTVar1;
  size_t sVar2;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar3;
  long lVar4;
  pointer ppTVar5;
  
  (this->root).ptr = 8;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  this->numPrimitives = 0;
  FastAllocator::internal_fix_used_blocks(&this->alloc);
  ppTVar1 = (this->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar5 = (this->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1;
      ppTVar5 = ppTVar5 + 1) {
    FastAllocator::ThreadLocal2::unbind(*ppTVar5,&this->alloc);
  }
  ppTVar5 = (this->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar5) {
    (this->alloc).thread_local_allocators.
    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar5;
  }
  LOCK();
  (this->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  if ((this->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
    FastAllocator::Block::clear_list
              ((this->alloc).usedBlocks._M_b._M_p,(this->alloc).device,(this->alloc).useUSM);
  }
  LOCK();
  (this->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if ((this->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
    FastAllocator::Block::clear_list
              ((this->alloc).freeBlocks._M_b._M_p,(this->alloc).device,(this->alloc).useUSM);
  }
  LOCK();
  (this->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  for (lVar4 = -0x40; lVar4 != 0; lVar4 = lVar4 + 8) {
    LOCK();
    *(undefined8 *)((long)&(this->alloc).threadBlocks[0]._M_b._M_p + lVar4) = 0;
    UNLOCK();
    LOCK();
    *(undefined8 *)((long)&(this->alloc).threadBlocks[8]._M_b._M_p + lVar4) = 0;
    UNLOCK();
  }
  sVar2 = (this->alloc).primrefarray.size_alloced;
  ptr = (this->alloc).primrefarray.items;
  if (ptr != (PrimRef *)0x0) {
    if (sVar2 << 5 < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,sVar2 << 5,(this->alloc).primrefarray.alloc.hugepages);
    }
  }
  if (sVar2 != 0) {
    pMVar3 = (this->alloc).primrefarray.alloc.device;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar2 * -0x20,1);
  }
  (this->alloc).primrefarray.size_active = 0;
  (this->alloc).primrefarray.size_alloced = 0;
  (this->alloc).primrefarray.items = (PrimRef *)0x0;
  return;
}

Assistant:

void BVHN<N>::clear()
  {
    set(BVHN::emptyNode,empty,0);
    alloc.clear();
  }